

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::execute_scale(int *argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  double factor_00;
  string factor;
  string outfile_name;
  string geo_file_name;
  geofile primary_geofile;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  long local_2d8;
  size_type local_2d0 [2];
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  char *local_220;
  geofile local_218;
  
  if (*argc != 6) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,"Error: incorrect argument count.","");
    print_ln(&local_240);
    local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == &local_240.field_2) {
      return;
    }
    goto LAB_001102da;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,argv[3],(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,argv[4],(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,argv[5],(allocator<char> *)&local_218);
  bVar2 = GEO::is_e_notation(&local_320);
  if (bVar2) {
    GEO::geofile::geofile(&local_218);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,local_2e0,local_2e0->_M_local_buf + local_2d8);
    iVar3 = GEO::geofile::import_geofile(&local_218,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    _Var6._M_p = local_320._M_dataplus._M_p;
    if (iVar3 == 0) {
      plVar4 = (long *)__errno_location();
      lVar1 = *plVar4;
      *(undefined4 *)plVar4 = 0;
      factor_00 = strtod(_Var6._M_p,&local_220);
      if (local_220 == _Var6._M_p) {
        uVar5 = std::__throw_invalid_argument("stod");
        if ((long *)local_260._M_dataplus._M_p != plVar4) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        GEO::geofile::~geofile(&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != local_2f0) {
          operator_delete(local_300,local_2f0[0] + 1);
        }
        if (local_2e0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0) {
          operator_delete(local_2e0,local_2d0[0] + 1);
        }
        _Unwind_Resume(uVar5);
      }
      if ((int)*plVar4 == 0) {
LAB_00110144:
        *(int *)plVar4 = (int)lVar1;
      }
      else if ((int)*plVar4 == 0x22) {
        factor_00 = (double)std::__throw_out_of_range("stod");
        goto LAB_00110144;
      }
      iVar3 = GEO::geofile::scale_data(&local_218,factor_00);
      if (iVar3 == 0) {
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_360,local_300,local_2f8 + (long)local_300);
        iVar3 = GEO::geofile::export_geofile(&local_218,&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          paVar7 = &local_260.field_2;
          local_260._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_260,"Export Succeeded.","");
          print_ln(&local_260);
          _Var6._M_p = local_260._M_dataplus._M_p;
        }
        else {
          paVar7 = &local_280.field_2;
          local_280._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,"Error: Export failed.","");
          print_ln(&local_280);
          _Var6._M_p = local_280._M_dataplus._M_p;
        }
      }
      else {
        paVar7 = &local_2a0.field_2;
        local_2a0._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a0,"Error: Scaling failed.","");
        print_ln(&local_2a0);
        _Var6._M_p = local_2a0._M_dataplus._M_p;
      }
    }
    else {
      paVar7 = &local_2c0.field_2;
      local_2c0._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,"Error: Import of Geofile failed.","");
      print_ln(&local_2c0);
      _Var6._M_p = local_2c0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p,paVar7->_M_allocated_capacity + 1);
    }
    GEO::geofile::~geofile(&local_218);
  }
  else {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_380,"Error: Scaling factor not valid.","");
    print_ln(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  local_240.field_2._M_allocated_capacity = local_2d0[0];
  if (local_2e0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0) {
    return;
  }
LAB_001102da:
  operator_delete(local_2e0,local_240.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void UI::execute_scale(int &argc, char *argv[])
{
    if (argc!=6)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string geo_file_name   = argv[3];
        std::string outfile_name    = argv[4];
        std::string factor          = argv[5];
        if (GEO::is_e_notation(factor))
        {
            GEO::geofile primary_geofile;
            if (primary_geofile.import_geofile(geo_file_name)==EXIT_SUCCESS)
            {
                double fac=std::stod(factor);
                if(primary_geofile.scale_data(fac)==EXIT_SUCCESS)
                {
                    if (primary_geofile.export_geofile(outfile_name)==EXIT_SUCCESS)
                        print_ln("Export Succeeded.");
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Scaling failed.");
            }
            else
                print_ln("Error: Import of Geofile failed.");
        }
        else
            print_ln("Error: Scaling factor not valid.");
    }
}